

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dekker.cpp
# Opt level: O0

void thread_fun_naive(int *self_lock,int *other_lock,int num,int *gp)

{
  bool bVar1;
  int local_3c;
  undefined1 auStack_38 [4];
  int i;
  anon_class_16_2_38981473 try_lock;
  int *gp_local;
  int *piStack_18;
  int num_local;
  int *other_lock_local;
  int *self_lock_local;
  
  _auStack_38 = &other_lock_local;
  try_lock.self_lock = &stack0xffffffffffffffe8;
  try_lock.other_lock = (int **)gp;
  piStack_18 = other_lock;
  other_lock_local = self_lock;
  for (local_3c = 0; local_3c < num; local_3c = local_3c + 1) {
    do {
      bVar1 = thread_fun_naive::anon_class_16_2_38981473::operator()
                        ((anon_class_16_2_38981473 *)auStack_38);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
    *(int *)try_lock.other_lock = *(int *)try_lock.other_lock + 1;
    *other_lock_local = 0;
  }
  return;
}

Assistant:

void thread_fun_naive(volatile int *self_lock, volatile int *other_lock, int num, int *gp)
{
    // This obviously doesn't work
    auto try_lock = [&] () {
        *self_lock = 1;
        if (*other_lock == 0)
            return true;
        *self_lock = 0;
        return false;
    };
    for (int i = 0;i < num;i++) {
        while (!try_lock())
            pause();
        *gp += 1;
        *self_lock = 0;
    }
}